

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitEnumStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,EnumStmt *stmt)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> *this_00;
  reference pVVar4;
  pointer pTVar5;
  undefined4 extraout_var;
  Variant *variant;
  iterator __end1;
  iterator __begin1;
  vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> *__range1;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  EnumStmt *local_20;
  EnumStmt *stmt_local;
  AstSerialise *this_local;
  
  local_20 = stmt;
  stmt_local = (EnumStmt *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = std::operator<<(local_198,"(Stmt::Enum ");
  poVar3 = std::operator<<(poVar3,(string *)&(local_20->name).lexeme);
  std::operator<<(poVar3," (");
  std::operator<<(local_198,") (\n");
  std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
  this_00 = &local_20->variants;
  __end1 = std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::begin
                     (this_00);
  variant = (Variant *)
            std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::end
                      (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<enact::EnumStmt::Variant_*,_std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>_>
                                *)&variant);
    if (!bVar1) break;
    pVVar4 = __gnu_cxx::
             __normal_iterator<enact::EnumStmt::Variant_*,_std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>_>
             ::operator*(&__end1);
    poVar3 = std::operator<<(local_198,(string *)&this->m_ident);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = std::operator<<(poVar3,(string *)&(pVVar4->name).lexeme);
    poVar3 = std::operator<<(poVar3," ");
    pTVar5 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
             operator->(&pVVar4->typename_);
    iVar2 = (*pTVar5->_vptr_Typename[4])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    std::operator<<(poVar3,")\n");
    __gnu_cxx::
    __normal_iterator<enact::EnumStmt::Variant_*,_std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::operator<<(local_198,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitEnumStmt(EnumStmt &stmt) {
        std::stringstream s;
        s << "(Stmt::Enum " << stmt.name.lexeme << " (";

        s << ") (\n";
        m_ident += "    ";

        for (const EnumStmt::Variant& variant : stmt.variants) {
            s << m_ident << "(" << variant.name.lexeme << " " << variant.typename_->name() << ")\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }